

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int matchmemaddr(expr **iex,expr **niex1,expr **niex2,expr **piex,expr *expr,int flip)

{
  int iVar1;
  expr **in_RCX;
  expr **in_RDX;
  expr **in_RSI;
  expr *in_R8;
  int in_R9D;
  byte in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  bool bVar2;
  uint local_4;
  
  if ((in_R8->type == EXPR_PIADD) || (in_R8->type == EXPR_PISUB)) {
    if ((in_R9D == 0) && (in_R8->expr2->isimm != 0)) {
      iVar1 = matchmemaddr(in_RSI,in_RDX,in_RCX,(expr **)in_R8,
                           (expr *)(ulong)CONCAT13(in_stack_ffffffffffffffcb,
                                                   CONCAT12(in_stack_ffffffffffffffca,
                                                            CONCAT11(in_stack_ffffffffffffffc9,
                                                                     in_stack_ffffffffffffffc8))),0)
      ;
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = addexpr((expr **)in_R8,
                        (expr *)CONCAT44(in_R9D,(uint)CONCAT12(in_stack_ffffffffffffffca,
                                                               CONCAT11(in_stack_ffffffffffffffc9,
                                                                        in_stack_ffffffffffffffc8)))
                        ,0);
        bVar2 = iVar1 != 0;
      }
      local_4 = (uint)bVar2;
    }
    else {
      local_4 = 0;
    }
  }
  else if (in_R8->isimm == 0) {
    if (in_R8->type == EXPR_ADD) {
      iVar1 = matchmemaddr(in_RSI,in_RDX,in_RCX,(expr **)in_R8,
                           (expr *)CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffcb,
                                                            CONCAT12(in_stack_ffffffffffffffca,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8)))),0);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = matchmemaddr(in_RSI,in_RDX,in_RCX,(expr **)in_R8,
                             (expr *)CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffcb,
                                                              (uint3)CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8))),0);
        bVar2 = iVar1 != 0;
      }
      local_4 = (uint)bVar2;
    }
    else if (in_R8->type == EXPR_SUB) {
      iVar1 = matchmemaddr(in_RSI,in_RDX,in_RCX,(expr **)in_R8,
                           (expr *)CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffcb,
                                                            CONCAT12(in_stack_ffffffffffffffca,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8)))),0);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = matchmemaddr(in_RSI,in_RDX,in_RCX,(expr **)in_R8,
                             (expr *)CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffcb,
                                                              CONCAT12(in_stack_ffffffffffffffca,
                                                                       (ushort)
                                                  in_stack_ffffffffffffffc8))),0);
        bVar2 = iVar1 != 0;
      }
      local_4 = (uint)bVar2;
    }
    else if (in_R8->type == EXPR_NEG) {
      local_4 = matchmemaddr(in_RSI,in_RDX,in_RCX,(expr **)in_R8,
                             (expr *)CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffcb,
                                                              CONCAT12(in_stack_ffffffffffffffca,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8)))),0);
    }
    else if (in_R9D == 0) {
      if ((in_RSI == (expr **)0x0) || (*in_RSI != (expr *)0x0)) {
        if ((in_RDX == (expr **)0x0) || (*in_RDX != (expr *)0x0)) {
          return 0;
        }
        *in_RDX = in_R8;
      }
      else {
        *in_RSI = in_R8;
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = addexpr((expr **)in_R8,
                      (expr *)CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffcb,
                                                       CONCAT12(in_stack_ffffffffffffffca,
                                                                CONCAT11(in_stack_ffffffffffffffc9,
                                                                         in_stack_ffffffffffffffc8))
                                                      )),0);
  }
  return local_4;
}

Assistant:

int matchmemaddr(const struct expr **iex, const struct expr **niex1, const struct expr **niex2, const struct expr **piex, const struct expr *expr, int flip) {
	if (expr->type == EXPR_PIADD || expr->type == EXPR_PISUB) {
		if (flip || !expr->expr2->isimm)
			return 0;
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, 0) && addexpr(piex, expr->expr2, expr->type == EXPR_PISUB);
	}
	if (expr->isimm)
		return addexpr(iex, expr, flip);
	if (expr->type == EXPR_ADD)
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, flip) && matchmemaddr(iex, niex1, niex2, piex, expr->expr2, flip);
	if (expr->type == EXPR_SUB)
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, flip) && matchmemaddr(iex, niex1, niex2, piex, expr->expr2, !flip);
	if (expr->type == EXPR_NEG)
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, !flip);
	if (flip)
		return 0;
	if (niex1 && !*niex1)
		*niex1 = expr;
	else if (niex2 && !*niex2)
		*niex2 = expr;
	else
		return 0;
	return 1;
}